

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_pow_scalar.c
# Opt level: O0

rt_function_error_t allocate_r_pow_scalar_local_context(rt_function_t *f)

{
  int iVar1;
  int iVar2;
  rt_list_t shape;
  rt_list_t shape_00;
  int output_size;
  int input_size;
  rt_function_t *f_local;
  
  if (f->num_of_inputs == 1) {
    if (f->num_of_outputs == 1) {
      shape._4_4_ = 0;
      shape.size = ((*f->inputs)->shape).size;
      shape.data = ((*f->inputs)->shape).data;
      iVar1 = calc_shape_size(shape);
      shape_00._4_4_ = 0;
      shape_00.size = ((*f->outputs)->shape).size;
      shape_00.data = ((*f->outputs)->shape).data;
      iVar2 = calc_shape_size(shape_00);
      if (iVar1 == iVar2) {
        if ((((*f->inputs)->field_0x10 & 0xf) == 0) && (((*f->outputs)->field_0x10 & 0xf) == 0)) {
          f->exec_func = exec_r_pow_scalar;
        }
        else {
          f->exec_func = exec_r_pow_scalar_generic;
        }
        f_local._4_4_ = RT_FUNCTION_ERROR_NOERROR;
      }
      else {
        f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_SHAPE;
      }
    }
    else {
      f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
    }
  }
  else {
    f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  return f_local._4_4_;
}

Assistant:

rt_function_error_t allocate_r_pow_scalar_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }
  int input_size = calc_shape_size(f->inputs[0]->shape);
  int output_size = calc_shape_size(f->outputs[0]->shape);
  if (input_size != output_size) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (f->inputs[0]->type == NN_DATA_TYPE_FLOAT &&
      f->outputs[0]->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_RPOWSCALAR_FLOAT32
    f->exec_func = exec_r_pow_scalar;
#endif /* CONFIG_RPOWSCALAR_FLOAT32 */
  } else {
#ifdef CONFIG_RPOWSCALAR_GENERIC
    f->exec_func = exec_r_pow_scalar_generic;
#endif /* CONFIG_RPOWSCALAR_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}